

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O2

Host * __thiscall Jupiter::HTTP::Server::Data::find_host(Data *this,string_view name)

{
  pointer puVar1;
  Host *pHVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  uint uVar4;
  pointer puVar5;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_30._M_str = name._M_str;
  local_30._M_len = name._M_len;
  uVar4 = calc_checksumi<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                    (&local_30);
  puVar5 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar1) {
      return (Host *)0x0;
    }
    pHVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
    if ((uVar4 == (pHVar2->super_Directory).name_checksum) &&
       (__x._M_str = local_30._M_str, __x._M_len = local_30._M_len,
       __y._M_str = (pHVar2->super_Directory).name._M_dataplus._M_p,
       __y._M_len = *(size_type *)((long)&(pHVar2->super_Directory).name + 8),
       bVar3 = std::operator==(__x,__y), bVar3)) break;
    puVar5 = puVar5 + 1;
  }
  return (puVar5->_M_t).
         super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
         ._M_t.
         super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
         .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
}

Assistant:

Jupiter::HTTP::Server::Host *Jupiter::HTTP::Server::Data::find_host(std::string_view name) {
	unsigned int name_checksum = calc_checksumi(name);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && host->name == name) {
			return host.get();
		}
	}

	return nullptr;
}